

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O3

basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_> *
make_delim_long<unsigned_char,std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
          (basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
           *__return_storage_ptr__,size_t length,uchar in_delim)

{
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  push_back(__return_storage_ptr__,in_delim);
  make_word<unsigned_char,std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
            (&local_40,length,in_delim);
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  _M_append(__return_storage_ptr__,local_40._M_dataplus._M_p,local_40._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  push_back(__return_storage_ptr__,in_delim);
  return __return_storage_ptr__;
}

Assistant:

ResultT make_delim_long(size_t length = 8, T in_delim = default_delim<T>) {
	// in this context, in_delim should be whatever was previously passed to make_word
	// doing so will ensure the value returned by this method is distinctly different from others
	ResultT result;
	result += in_delim;
	result += make_word<T>(length, in_delim);
	result += in_delim;
	return result;
}